

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTryExpr(BinaryReaderInterp *this,Type sig_type)

{
  FuncDesc *pFVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  value_type local_90;
  Type local_58;
  Location local_50;
  Enum local_30;
  u32 local_2c;
  Enum local_28;
  u32 value_stack_height;
  BinaryReaderInterp *pBStack_20;
  u32 exn_stack_height;
  BinaryReaderInterp *this_local;
  Type sig_type_local;
  
  pBStack_20 = this;
  unique0x10000211 = sig_type;
  sVar3 = std::
          vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
          ::size(&this->label_stack_);
  local_28 = (Enum)SharedValidator::GetCatchCount
                             (&this->validator_,(int)sVar3 - 1,&value_stack_height);
  bVar2 = Failed((Result)local_28);
  if (bVar2) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    sVar4 = SharedValidator::type_stack_size(&this->validator_);
    local_2c = (int)sVar4 + this->local_count_;
    GetLocation(&local_50,this);
    local_58 = stack0xffffffffffffffec;
    local_30 = (Enum)SharedValidator::OnTry(&this->validator_,&local_50,stack0xffffffffffffffec);
    bVar2 = Failed((Result)local_30);
    if (bVar2) {
      Result::Result((Result *)&sig_type_local,Error);
    }
    else {
      sVar3 = std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
              size(&this->func_->handlers);
      PushLabel(this,Try,0xffffffff,0xffffffff,(u32)sVar3);
      pFVar1 = this->func_;
      local_90.kind = Catch;
      local_90.try_start_offset = Istream::end(this->istream_);
      local_90.try_end_offset = 0xffffffff;
      memset(&local_90.catches,0,0x18);
      std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::vector
                (&local_90.catches);
      local_90.field_4.catch_all_offset = 0xffffffff;
      local_90.values = local_2c;
      local_90.exceptions = value_stack_height;
      local_90.catch_all_ref = false;
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::push_back
                (&pFVar1->handlers,&local_90);
      HandlerDesc::~HandlerDesc(&local_90);
      Result::Result((Result *)&sig_type_local,Ok);
    }
  }
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnTryExpr(Type sig_type) {
  u32 exn_stack_height;
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &exn_stack_height));
  // NOTE: *NOT* GetLocalCount. we don't count the parameters, as they're not
  // part of the frame.
  u32 value_stack_height = validator_.type_stack_size() + local_count_;
  CHECK_RESULT(validator_.OnTry(GetLocation(), sig_type));
  // Push a label that tracks mapping of exn -> catch
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        value_stack_height,
                                        exn_stack_height});
  return Result::Ok;
}